

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

MPP_RET vdpu383_av1d_wait(void *hal,HalTaskInfo *task)

{
  MppFrame local_48;
  MppFrame local_40;
  MppFrame mframe;
  Vdpu383Av1dRegSet *p_regs;
  Vdpu383Av1dRegCtx *reg_ctx;
  Av1dHalCtx *p_hal;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  p_hal._4_4_ = 0xfffffffe;
  reg_ctx = (Vdpu383Av1dRegCtx *)hal;
  pHStack_18 = task;
  task_local = (HalTaskInfo *)hal;
  if (hal == (void *)0x0) {
    p_hal._4_4_ = 0xfffffc16;
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu383","input empty(%d).\n",(char *)0x0,0xa04);
    }
  }
  else {
    p_regs = *(Vdpu383Av1dRegSet **)((long)hal + 0x50);
    if (*(int *)((long)hal + 0x58) == 0) {
      local_48 = *(MppFrame *)p_regs;
    }
    else {
      local_48 = *(MppFrame *)
                  ((p_regs->ctrl_regs).reserve_reg24_26 + (long)(task->dec).reg_index * 4 + -0xb);
    }
    mframe = local_48;
    if ((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) {
      p_hal._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x48),0x10,(void *)0x0);
      if (p_hal._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_av1d_vdpu383","poll cmd failed %d\n","vdpu383_av1d_wait",
                   (ulong)(uint)p_hal._4_4_);
      }
      if ((((((((pHStack_18->dec).flags.val >> 2 & 1) != 0) ||
             (((pHStack_18->dec).flags.val >> 3 & 1) != 0)) ||
            ((*(uint *)((long)mframe + 0x20) & 1) == 0)) ||
           (((*(uint *)((long)mframe + 0x20) >> 1 & 1) != 0 ||
            ((*(uint *)((long)mframe + 0x20) >> 2 & 1) != 0)))) ||
          (((*(uint *)((long)mframe + 0x20) >> 3 & 1) != 0 ||
           (((*(uint *)((long)mframe + 0x20) >> 4 & 1) != 0 ||
            ((*(uint *)((long)mframe + 0x20) >> 5 & 1) != 0)))))) ||
         ((*(uint *)((long)mframe + 0x20) >> 6 & 1) != 0)) {
        local_40 = (MppFrame)0x0;
        mpp_buf_slot_get_prop
                  (*(MppBufSlots *)(reg_ctx->reg_buf + 1),(pHStack_18->dec).output,SLOT_FRAME_PTR,
                   &local_40);
        mpp_frame_set_errinfo(local_40,1);
      }
    }
    if (reg_ctx->uncmps_offset[0] != 0) {
      (p_regs->ctrl_regs).reserve_reg24_26[(long)(pHStack_18->dec).reg_index * 4 + -0xd] = 0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;

    INP_CHECK(ret, NULL == p_hal);
    Vdpu383Av1dRegCtx *reg_ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *p_regs = p_hal->fast_mode ?
                                reg_ctx->reg_buf[task->dec.reg_index].regs :
                                reg_ctx->regs;
#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        char *cur_fname = "colmv_cur_frame.dat";
        DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
        HalBuf *mv_buf = NULL;
        mv_buf = hal_bufs_get_buf(reg_ctx->colmv_bufs, dxva->CurrPic.Index7Bits);
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mv_buf->buf[0]),
                          8 * mpp_buffer_get_size(mv_buf->buf[0]), 64, 0, 0);
    }
    {
        char *cur_fname = "decout.dat";
        MppBuffer mbuffer = NULL;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer),
                          8 * mpp_buffer_get_size(mbuffer), 128, 0, 0);
    }
#endif

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        goto __SKIP_HARD;
    }

    // rcb_buf_dump_edge(reg_ctx, p_hal->fast_mode ? reg_ctx->rcb_bufs[task->dec.reg_index] : reg_ctx->rcb_bufs[0]);
    // {
    //     MppBuffer mbuffer = NULL;
    //     mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
    //     VDPU383_DUMP_BUF_PROTECT_VAL(mpp_buffer_get_ptr(mbuffer), mpp_buffer_get_size(mbuffer), 128);
    // }

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);
#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        char *cur_fname = "cabac_cdf_out.dat";
        HalBuf *cdf_buf = NULL;
        DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
        memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
        sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
        cdf_buf = hal_bufs_get_buf(reg_ctx->cdf_bufs, dxva->CurrPic.Index7Bits);
        dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(cdf_buf->buf[0]),
                          (NON_COEF_CDF_SIZE + COEF_CDF_SIZE) * 8, 128, 0, 0);
    }
#endif

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        (!p_regs->ctrl_regs.reg15.rkvdec_frame_rdy_sta) ||
        p_regs->ctrl_regs.reg15.rkvdec_strm_error_sta ||
        p_regs->ctrl_regs.reg15.rkvdec_core_timeout_sta ||
        p_regs->ctrl_regs.reg15.rkvdec_ip_timeout_sta ||
        p_regs->ctrl_regs.reg15.rkvdec_bus_error_sta ||
        p_regs->ctrl_regs.reg15.rkvdec_buffer_empty_sta ||
        p_regs->ctrl_regs.reg15.rkvdec_colmv_ref_error_sta) {
        MppFrame mframe = NULL;

        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_frame_set_errinfo(mframe, 1);
    }

__SKIP_HARD:
    if (p_hal->fast_mode)
        reg_ctx->reg_buf[task->dec.reg_index].valid = 0;

    (void)task;
__RETURN:
    return ret = MPP_OK;
}